

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_IntVect.H
# Opt level: O1

void __thiscall
amrex::FabArray<amrex::IArrayBox>::FillBoundary<int>
          (FabArray<amrex::IArrayBox> *this,Periodicity *period,bool cross)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (this->super_FabArrayBase).n_grow.vect[0];
  iVar2 = (this->super_FabArrayBase).n_grow.vect[1];
  if (iVar2 < iVar1) {
    iVar2 = iVar1;
  }
  iVar1 = (this->super_FabArrayBase).n_grow.vect[2];
  if (iVar2 <= iVar1) {
    iVar2 = iVar1;
  }
  if (0 < iVar2) {
    FBEP_nowait<int,_amrex::IArrayBox,_0>
              (this,0,(this->super_FabArrayBase).n_comp,&(this->super_FabArrayBase).n_grow,period,
               cross,false,false);
  }
  return;
}

Assistant:

int max () const noexcept
    {
#if (AMREX_SPACEDIM == 1)
        return vect[0];
#elif (AMREX_SPACEDIM == 2)
        return (vect[0] > vect[1] ? vect[0] : vect[1]);
#else
        int r = vect[0] > vect[1] ? vect[0] : vect[1];
        return (r > vect[2]) ? r : vect[2];
#endif
    }